

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsConvertValueToString(JsValueRef value,JsValueRef *result)

{
  int iVar1;
  ScriptContext *pSVar2;
  ScriptContext *pSVar3;
  undefined1 auVar4 [8];
  bool bVar5;
  JsrtContext *pJVar6;
  RecyclableObject *pRVar7;
  JavascriptString *pJVar8;
  JsErrorCode JVar9;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_78 [8];
  EnterScriptObject __enterScriptObject;
  TTDJsRTActionResultAutoRecorder local_48;
  AutoNestedHandledExceptionType local_2c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType_1;
  
  if (result == (JsValueRef *)0x0) {
    return JsErrorNullArgument;
  }
  *result = (JsValueRef)0x0;
  if (((ulong)value >> 0x30 != 0 || value == (JsValueRef)0x0) ||
     (bVar5 = Js::VarIsImpl<Js::JavascriptString>((RecyclableObject *)value), !bVar5)) {
    local_48.m_actionEvent = (EventLogEntry *)0x0;
    local_48.m_resultPtr = (TTDVar *)0x0;
    pJVar6 = JsrtContext::GetCurrent();
    if (pJVar6 == (JsrtContext *)0x0) {
      return JsErrorNoCurrentContext;
    }
    pSVar2 = (((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_2c,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    auStack_b8 = (undefined1  [8])0x0;
    ___autoNestedHandledExceptionType = (void *)0x0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)auStack_78,pSVar2,(ScriptEntryExitRecord *)auStack_b8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(pSVar2,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)auStack_78);
    if (pSVar2->TTDShouldPerformRecordAction == true) {
      TTD::EventLog::RecordJsRTVarToStringConversion(pSVar2->threadContext->TTDLog,&local_48,value);
    }
    if (value == (JsValueRef)0x0) {
      JVar9 = JsErrorInvalidArgument;
    }
    else {
      if ((ulong)value >> 0x30 == 0) {
        pRVar7 = Js::VarTo<Js::RecyclableObject>(value);
        pSVar3 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        if (pSVar3 != pSVar2) {
          JVar9 = JsErrorWrongRuntime;
          if (pSVar3->threadContext != pSVar2->threadContext) goto LAB_0036d7a5;
          value = Js::CrossSite::MarshalVar(pSVar2,pRVar7,false);
        }
      }
      pJVar8 = Js::JavascriptConversion::ToString(value,pSVar2);
      *result = pJVar8;
      JVar9 = JsNoError;
      if (pSVar2->TTDShouldPerformRecordAction == true) {
        if (local_48.m_resultPtr == (TTDVar *)0x0) {
          TTDAbort_unrecoverable_error("Why are we calling this then???");
        }
        *local_48.m_resultPtr = pJVar8;
      }
    }
LAB_0036d7a5:
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)auStack_78);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_2c);
    if ((ScriptEntryExitRecord *)local_48.m_actionEvent == (ScriptEntryExitRecord *)0x0) {
      return JVar9;
    }
    iVar1 = (local_48.m_actionEvent)->ResultStatus;
    auVar4 = (undefined1  [8])local_48.m_actionEvent;
    goto joined_r0x0036d7c4;
  }
  auStack_78 = (undefined1  [8])0x0;
  __enterScriptObject.entryExitRecord = (ScriptEntryExitRecord *)0x0;
  pJVar6 = JsrtContext::GetCurrent();
  if (pJVar6 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  pSVar2 = (((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)auStack_b8,
             ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (pSVar2->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTVarToStringConversion
              (pSVar2->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_78,value);
  }
  pRVar7 = Js::VarTo<Js::RecyclableObject>(value);
  pSVar3 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (pSVar3 == pSVar2) {
LAB_0036d627:
    *result = value;
    JVar9 = JsNoError;
    if (pSVar2->TTDShouldPerformRecordAction == true) {
      if (__enterScriptObject.entryExitRecord == (ScriptEntryExitRecord *)0x0) {
        TTDAbort_unrecoverable_error("Why are we calling this then???");
      }
      *(JsValueRef *)__enterScriptObject.entryExitRecord = value;
    }
  }
  else {
    JVar9 = JsErrorWrongRuntime;
    if (pSVar3->threadContext == pSVar2->threadContext) {
      value = Js::CrossSite::MarshalVar(pSVar2,pRVar7,false);
      goto LAB_0036d627;
    }
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)auStack_b8);
  if (auStack_78 == (undefined1  [8])0x0) {
    return JVar9;
  }
  iVar1 = *(int32 *)((long)auStack_78 + 4);
  auVar4 = auStack_78;
joined_r0x0036d7c4:
  if (iVar1 != -1) {
    TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
  }
  *(JsErrorCode *)&((ScriptEntryExitRecord *)auVar4)->field_0x4 = JVar9;
  return JVar9;
}

Assistant:

CHAKRA_API JsConvertValueToString(_In_ JsValueRef value, _Out_ JsValueRef *result)
{
    PARAM_NOT_NULL(result);
    *result = nullptr;

    if (value != nullptr && Js::VarIs<Js::JavascriptString>(value))
    {
        return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
            PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTVarToStringConversion, (Js::Var)value);
            VALIDATE_INCOMING_REFERENCE(value, scriptContext);

            *result = value;

            PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

            return JsNoError;
        });
    }

    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTVarToStringConversion, (Js::Var)value);
        VALIDATE_INCOMING_REFERENCE(value, scriptContext);

        *result = (JsValueRef) Js::JavascriptConversion::ToString((Js::Var)value, scriptContext);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}